

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerators::GenerateQrc(cmQtAutoGenerators *this)

{
  string *psVar1;
  bool bVar2;
  iterator iVar3;
  ostream *poVar4;
  string *filename;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string output;
  int retVal;
  string rcc_output_file;
  string basename;
  int sourceNewerThanQrc;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  filename = (this->RccSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar1 = (this->RccSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename == psVar1) {
LAB_0037a935:
      return filename == psVar1;
    }
    cmsys::SystemTools::GetFilenameLastExtension(&ext,filename);
    bVar2 = std::operator!=(&ext,".qrc");
    if (!bVar2) {
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&command,&this->RccExecutable);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,filename);
      std::operator+(&local_50,&this->Builddir,"CMakeFiles/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retVal,
                     &local_50,&this->OriginTargetName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sourceNewerThanQrc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retVal,
                     ".dir/qrc_");
      std::operator+(&output,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sourceNewerThanQrc,&basename);
      std::operator+(&rcc_output_file,&output,".cpp");
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&sourceNewerThanQrc);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&local_50);
      sourceNewerThanQrc = 0;
      bVar2 = cmsys::SystemTools::FileTimeCompare(filename,&rcc_output_file,&sourceNewerThanQrc);
      if ((!bVar2 || -1 < sourceNewerThanQrc) ||
         (bVar2 = InputFilesNewerThanQrc(this,filename,&rcc_output_file),
         (bVar2 | this->GenerateAll) == 1)) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->RccOptions)._M_t,filename);
        if ((_Rb_tree_header *)iVar3._M_node !=
            &(this->RccOptions)._M_t._M_impl.super__Rb_tree_header) {
          cmSystemTools::ExpandListArgument((string *)(iVar3._M_node + 2),&command,false);
        }
        std::__cxx11::string::string((string *)&output,"-name",(allocator *)&retVal);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
                   &output);
        std::__cxx11::string::~string((string *)&output);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&command,&basename);
        std::__cxx11::string::string((string *)&output,"-o",(allocator *)&retVal);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
                   &output);
        std::__cxx11::string::~string((string *)&output);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&command,&rcc_output_file);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&command,filename);
        pbVar5 = command.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (this->Verbose == true) {
          for (; pbVar5 != command.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
            std::operator<<(poVar4," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        retVal = 0;
        bVar2 = cmSystemTools::RunSingleCommand
                          (&command,&output,&output,&retVal,(char *)0x0,OUTPUT_MERGE,0.0);
        if (!bVar2 || retVal != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"AUTORCC: error: process for ");
          poVar4 = std::operator<<(poVar4,(string *)&rcc_output_file);
          poVar4 = std::operator<<(poVar4," failed:\n");
          poVar4 = std::operator<<(poVar4,(string *)&output);
          std::endl<char,std::char_traits<char>>(poVar4);
          this->RunRccFailed = true;
          cmsys::SystemTools::RemoveFile(&rcc_output_file);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::string::~string((string *)&rcc_output_file);
          std::__cxx11::string::~string((string *)&basename);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&command);
          std::__cxx11::string::~string((string *)&ext);
          goto LAB_0037a935;
        }
        std::__cxx11::string::~string((string *)&output);
      }
      std::__cxx11::string::~string((string *)&rcc_output_file);
      std::__cxx11::string::~string((string *)&basename);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&command);
    }
    std::__cxx11::string::~string((string *)&ext);
    filename = filename + 1;
  } while( true );
}

Assistant:

void cmQtAutoGenerators::SetupAutoRccTarget(cmTarget const* target)
{
  std::string _rcc_files;
  const char* sepRccFiles = "";
  cmMakefile *makefile = target->GetMakefile();

  std::vector<cmSourceFile*> srcFiles;
  target->GetConfigCommonSourceFiles(srcFiles);

  std::string qrcInputs;
  const char* qrcInputsSep = "";

  std::string rccFileFiles;
  std::string rccFileOptions;
  const char *optionSep = "";

  const char *qtVersion = makefile->GetDefinition("_target_qt_version");

  std::vector<std::string> rccOptions;
  if (const char* opts = target->GetProperty("AUTORCC_OPTIONS"))
    {
    cmSystemTools::ExpandListArgument(opts, rccOptions);
    }
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion == "")
    {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
    }

  for(std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
      fileIt != srcFiles.end();
      ++fileIt)
    {
    cmSourceFile* sf = *fileIt;
    std::string ext = sf->GetExtension();
    if (ext == "qrc")
      {
      std::string absFile = cmsys::SystemTools::GetRealPath(
                                                  sf->GetFullPath());
      bool skip = cmSystemTools::IsOn(sf->GetPropertyForUser("SKIP_AUTORCC"));

      if (!skip)
        {
        _rcc_files += sepRccFiles;
        _rcc_files += absFile;
        sepRccFiles = ";";

        if (const char *prop = sf->GetProperty("AUTORCC_OPTIONS"))
          {
          std::vector<std::string> optsVec;
          cmSystemTools::ExpandListArgument(prop, optsVec);
          this->MergeRccOptions(rccOptions, optsVec,
                                strcmp(qtVersion, "5") == 0);
          }

        if (!rccOptions.empty())
          {
          rccFileFiles += optionSep;
          rccFileFiles += absFile;
          rccFileOptions += optionSep;
          }
        const char *listSep = "";
        for(std::vector<std::string>::const_iterator it = rccOptions.begin();
            it != rccOptions.end();
            ++it)
          {
          rccFileOptions += listSep;
          rccFileOptions += *it;
          listSep = "@list_sep@";
          }
        optionSep = ";";

        std::vector<std::string> depends;

        std::string entriesList;
        if (!cmSystemTools::IsOn(sf->GetPropertyForUser("GENERATED")))
          {
          if (qtMajorVersion == "5")
            {
            entriesList = this->ListQt5RccInputs(sf, target, depends);
            }
          else
            {
            entriesList = this->ListQt4RccInputs(sf, depends);
            }
          if (entriesList.empty())
            {
            return;
            }
          }
        qrcInputs += qrcInputsSep;
        qrcInputs += entriesList;
        qrcInputsSep = ";";
        }
      }
    }
  makefile->AddDefinition("_qt_rcc_inputs_" + target->GetName(),
                      cmOutputConverter::EscapeForCMake(qrcInputs).c_str());

  makefile->AddDefinition("_rcc_files",
          cmOutputConverter::EscapeForCMake(_rcc_files).c_str());

  makefile->AddDefinition("_qt_rcc_options_files",
              cmOutputConverter::EscapeForCMake(rccFileFiles).c_str());
  makefile->AddDefinition("_qt_rcc_options_options",
            cmOutputConverter::EscapeForCMake(rccFileOptions).c_str());

  makefile->AddDefinition("_qt_rcc_executable",
                          this->GetRccExecutable(target).c_str());
}